

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

int __thiscall QAnimationTimer::closestPauseAnimationTimeToFinish(QAnimationTimer *this)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  parameter_type pVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  lVar1 = *(long *)(this + 0x70);
  if (lVar1 == 0) {
    iVar6 = 0x7fffffff;
  }
  else {
    lVar2 = *(long *)(this + 0x68);
    iVar6 = 0x7fffffff;
    lVar7 = 0;
    do {
      plVar3 = *(long **)(lVar2 + lVar7);
      pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                       *)(plVar3[1] + 0x7c));
      if (pVar4 == Forward) {
        iVar5 = (**(code **)(*plVar3 + 0x60))(plVar3);
        iVar5 = iVar5 - *(int *)(plVar3[1] + 0x84);
      }
      else {
        iVar5 = *(int *)(plVar3[1] + 0x84);
      }
      if (iVar5 < iVar6) {
        iVar6 = iVar5;
      }
      lVar7 = lVar7 + 8;
    } while (lVar1 << 3 != lVar7);
  }
  return iVar6;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }